

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# admin.cpp
# Opt level: O3

void Commands::Duty(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  byte bVar1;
  World *pWVar2;
  pointer ppCVar3;
  size_t __n;
  Character *character;
  string *psVar4;
  Player *pPVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  mapped_type *pmVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Map *pMVar12;
  uchar byte;
  pointer ppCVar13;
  _List_node_base *p_Var14;
  _Hash_node_base *p_Var15;
  long lVar16;
  PacketBuilder reply;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  ac;
  string guild_rank;
  string guild_str;
  undefined1 local_1c0 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  local_190;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_130;
  Player *local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_120;
  World *local_118;
  string local_110;
  key_type local_f0;
  key_type local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pWVar2 = from->world;
  local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"UseDutyAdmin","");
  local_130 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&pWVar2->config;
  pmVar11 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](local_130,&local_190.first);
  bVar6 = util::variant::GetBool(pmVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
    operator_delete(local_190.first._M_dataplus._M_p,
                    local_190.first.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_128 = from->player;
    ppCVar13 = (local_128->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppCVar3 = (local_128->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_120 = arguments;
    local_118 = pWVar2;
    if (ppCVar13 != ppCVar3) {
      psVar4 = &local_128->dutylast;
      __n = (local_128->dutylast)._M_string_length;
      do {
        character = *ppCVar13;
        if (__n == 0) {
          if ((character != from) && (character->admin != ADMIN_PLAYER)) {
            std::__cxx11::string::_M_assign((string *)psVar4);
            Character::Logout(from);
            local_128->character = character;
            psVar4 = (local_120->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((local_120->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish != psVar4) {
              util::lowercase(&local_190.first,psVar4);
              iVar7 = std::__cxx11::string::compare((char *)&local_190);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
                operator_delete(local_190.first._M_dataplus._M_p,
                                local_190.first.field_2._M_allocated_capacity + 1);
              }
              if (iVar7 == 0) {
                character->mapid = from->mapid;
                character->x = from->x;
                character->y = from->y;
                character->direction = from->direction;
                character->sitting = from->sitting;
              }
            }
            goto LAB_0011f70c;
          }
        }
        else if (((character->real_name)._M_string_length == __n) &&
                (iVar7 = bcmp((character->real_name)._M_dataplus._M_p,(psVar4->_M_dataplus)._M_p,__n
                             ), pPVar5 = local_128, iVar7 == 0)) {
          (local_128->dutylast)._M_string_length = 0;
          *(local_128->dutylast)._M_dataplus._M_p = '\0';
          Character::Logout(from);
          pPVar5->character = character;
LAB_0011f70c:
          pWVar2 = local_118;
          (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_190,from);
          std::__cxx11::string::operator=((string *)&character->faux_name,(string *)&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
            operator_delete(local_190.first._M_dataplus._M_p,
                            local_190.first.field_2._M_allocated_capacity + 1);
          }
          World::Login(pWVar2,character);
          Character::CalculateStats(character,true);
          Character::GuildNameString_abi_cxx11_(&local_90,character);
          Character::GuildRankString_abi_cxx11_(&local_b0,character);
          (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_190,character);
          PacketBuilder::PacketBuilder
                    ((PacketBuilder *)local_1c0,PACKET_WELCOME,PACKET_REPLY,
                     local_190.first._M_string_length +
                     local_b0._M_string_length +
                     local_90._M_string_length + (character->title)._M_string_length + 0x90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
            operator_delete(local_190.first._M_dataplus._M_p,
                            local_190.first.field_2._M_allocated_capacity + 1);
          }
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,1);
          iVar7 = Character::PlayerID(character);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,iVar7);
          PacketBuilder::AddInt((PacketBuilder *)local_1c0,character->id);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,(int)character->mapid);
          local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"GlobalPK","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_130,&local_190.first);
          bVar6 = util::variant::GetBool(pmVar11);
          if (bVar6) {
            bVar6 = World::PKExcept(pWVar2,(int)character->mapid);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
              operator_delete(local_190.first._M_dataplus._M_p,
                              local_190.first.field_2._M_allocated_capacity + 1);
            }
            if (bVar6) goto LAB_0011f8c2;
            byte = '\x01';
            PacketBuilder::AddByte((PacketBuilder *)local_1c0,0xff);
          }
          else {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
              operator_delete(local_190.first._M_dataplus._M_p,
                              local_190.first.field_2._M_allocated_capacity + 1);
            }
LAB_0011f8c2:
            pMVar12 = World::GetMap(pWVar2,character->mapid);
            PacketBuilder::AddByte((PacketBuilder *)local_1c0,pMVar12->rid[0]);
            pMVar12 = World::GetMap(pWVar2,character->mapid);
            byte = pMVar12->rid[1];
          }
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,byte);
          pMVar12 = World::GetMap(pWVar2,character->mapid);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,pMVar12->rid[2]);
          pMVar12 = World::GetMap(pWVar2,character->mapid);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,pMVar12->rid[3]);
          pMVar12 = World::GetMap(pWVar2,character->mapid);
          PacketBuilder::AddThree((PacketBuilder *)local_1c0,pMVar12->filesize);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->eif->rid)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->eif->rid)._M_elems[1]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->eif->rid)._M_elems[2]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->eif->rid)._M_elems[3]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->eif->len)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->eif->len)._M_elems[1]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->enf->rid)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->enf->rid)._M_elems[1]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->enf->rid)._M_elems[2]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->enf->rid)._M_elems[3]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->enf->len)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->enf->len)._M_elems[1]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->esf->rid)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->esf->rid)._M_elems[1]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->esf->rid)._M_elems[2]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->esf->rid)._M_elems[3]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->esf->len)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->esf->len)._M_elems[1]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->ecf->rid)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->ecf->rid)._M_elems[1]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->ecf->rid)._M_elems[2]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->ecf->rid)._M_elems[3]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->ecf->len)._M_elems[0]);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,(pWVar2->ecf->len)._M_elems[1]);
          (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_190,character);
          PacketBuilder::AddBreakString((PacketBuilder *)local_1c0,&local_190.first,0xff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
            operator_delete(local_190.first._M_dataplus._M_p,
                            local_190.first.field_2._M_allocated_capacity + 1);
          }
          PacketBuilder::AddBreakString((PacketBuilder *)local_1c0,&character->title,0xff);
          PacketBuilder::AddBreakString((PacketBuilder *)local_1c0,&local_90,0xff);
          PacketBuilder::AddBreakString((PacketBuilder *)local_1c0,&local_b0,0xff);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,(uint)character->clas);
          Character::PaddedGuildTag_abi_cxx11_(&local_190.first,character);
          PacketBuilder::AddString((PacketBuilder *)local_1c0,&local_190.first);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
            operator_delete(local_190.first._M_dataplus._M_p,
                            local_190.first.field_2._M_allocated_capacity + 1);
          }
          p_Var15 = (pWVar2->admin_config).
                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                    ._M_h._M_before_begin._M_nxt;
          if (p_Var15 == (_Hash_node_base *)0x0) {
            local_120 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT71(local_120._1_7_,4);
          }
          else {
            local_120 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT71(local_120._1_7_,4);
            do {
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
              ::pair(&local_190,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                      *)(p_Var15 + 1));
              iVar7 = std::__cxx11::string::compare((char *)&local_190);
              if ((iVar7 != 0) &&
                 (iVar7 = std::__cxx11::string::compare((char *)&local_190), iVar7 != 0)) {
                util::variant::GetString_abi_cxx11_(&local_110,&local_190.second);
                iVar7 = util::to_int(&local_110);
                bVar1 = (byte)iVar7;
                if ((byte)local_120 < (byte)iVar7) {
                  bVar1 = (byte)local_120;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p,
                                  local_110.field_2._M_allocated_capacity + 1);
                }
                local_120 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT71(local_120._1_7_,bVar1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190.second.val_string._M_dataplus._M_p !=
                  &local_190.second.val_string.field_2) {
                operator_delete(local_190.second.val_string._M_dataplus._M_p,
                                local_190.second.val_string.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
                operator_delete(local_190.first._M_dataplus._M_p,
                                local_190.first.field_2._M_allocated_capacity + 1);
              }
              p_Var15 = p_Var15->_M_nxt;
            } while (p_Var15 != (_Hash_node_base *)0x0);
          }
          uVar8 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
          pWVar2 = local_118;
          local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"seehide","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar2->admin_config,&local_190.first);
          iVar7 = util::variant::GetInt(pmVar11);
          if ((int)(uVar8 & 0xff) < iVar7) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
              operator_delete(local_190.first._M_dataplus._M_p,
                              local_190.first.field_2._M_allocated_capacity + 1);
            }
LAB_0011fdc2:
            uVar8 = (*(character->super_Command_Source)._vptr_Command_Source[1])(character);
            local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"nowall","");
            pmVar11 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar2->admin_config,&local_190.first);
            iVar7 = util::variant::GetInt(pmVar11);
            if ((int)(uVar8 & 0xff) < iVar7) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
                operator_delete(local_190.first._M_dataplus._M_p,
                                local_190.first.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              iVar7 = (*(character->super_Command_Source)._vptr_Command_Source[1])(character);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
                operator_delete(local_190.first._M_dataplus._M_p,
                                local_190.first.field_2._M_allocated_capacity + 1);
              }
              uVar8 = 3;
              if ((byte)iVar7 < 3) goto LAB_0011fe84;
            }
            iVar7 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
            if (((byte)iVar7 < (byte)local_120) ||
               (iVar7 = (**(character->super_Command_Source)._vptr_Command_Source)(character),
               (char)iVar7 != '\0')) {
              uVar8 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
              uVar8 = uVar8 & 0xff;
            }
            else {
              uVar8 = 1;
            }
          }
          else {
            iVar7 = (**(character->super_Command_Source)._vptr_Command_Source)(character);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
              operator_delete(local_190.first._M_dataplus._M_p,
                              local_190.first.field_2._M_allocated_capacity + 1);
            }
            uVar8 = 4;
            if (3 < (byte)iVar7) goto LAB_0011fdc2;
          }
LAB_0011fe84:
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,uVar8);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,(uint)character->level);
          PacketBuilder::AddInt((PacketBuilder *)local_1c0,character->exp);
          PacketBuilder::AddInt((PacketBuilder *)local_1c0,character->usage);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->hp);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->maxhp);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->tp);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->maxtp);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->maxsp);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->statpoints);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->skillpoints);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->karma);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->mindam);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->maxdam);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->accuracy);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->evade);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,character->armor);
          local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_190,"OldVersionCompat","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_130,&local_190.first);
          bVar6 = util::variant::GetBool(pmVar11);
          if (bVar6) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
              operator_delete(local_190.first._M_dataplus._M_p,
                              local_190.first.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            iVar7 = local_128->client->version;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
              operator_delete(local_190.first._M_dataplus._M_p,
                              local_190.first.field_2._M_allocated_capacity + 1);
            }
            if (iVar7 < 0x1c) {
              PacketBuilder::AddChar((PacketBuilder *)local_1c0,*character->display_str);
              PacketBuilder::AddChar((PacketBuilder *)local_1c0,*character->display_wis);
              PacketBuilder::AddChar((PacketBuilder *)local_1c0,*character->display_intl);
              PacketBuilder::AddChar((PacketBuilder *)local_1c0,*character->display_agi);
              PacketBuilder::AddChar((PacketBuilder *)local_1c0,*character->display_con);
              PacketBuilder::AddChar((PacketBuilder *)local_1c0,*character->display_cha);
              goto LAB_0012011b;
            }
          }
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,*character->display_str);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,*character->display_wis);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,*character->display_intl);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,*character->display_agi);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,*character->display_con);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,*character->display_cha);
LAB_0012011b:
          lVar16 = 0x2e8;
          do {
            PacketBuilder::AddShort
                      ((PacketBuilder *)local_1c0,
                       *(int *)((long)&(character->super_Command_Source)._vptr_Command_Source +
                               lVar16));
            lVar16 = lVar16 + 4;
          } while (lVar16 != 0x324);
          local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"GuildEditRank","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_130,&local_190.first);
          iVar9 = util::variant::GetInt(pmVar11);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"GuildKickRank","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_130,&local_110);
          iVar7 = util::variant::GetInt(pmVar11);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"GuildPromoteRank","")
          ;
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_130,&local_d0);
          iVar10 = util::variant::GetInt(pmVar11);
          if (iVar7 < iVar9) {
            iVar7 = iVar9;
          }
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GuildDemoteRank","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_130,&local_f0);
          iVar9 = util::variant::GetInt(pmVar11);
          if (iVar10 < iVar7) {
            iVar10 = iVar7;
          }
          if (iVar10 <= iVar9) {
            iVar10 = iVar9;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
            operator_delete(local_190.first._M_dataplus._M_p,
                            local_190.first.field_2._M_allocated_capacity + 1);
          }
          uVar8 = (uint)character->guild_rank;
          if (((int)(uint)character->guild_rank <= iVar10) &&
             ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0)) {
            uVar8 = 1;
          }
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,uVar8);
          local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"JailMap","");
          pmVar11 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_130,&local_190.first);
          iVar7 = util::variant::GetInt(pmVar11);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,iVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
            operator_delete(local_190.first._M_dataplus._M_p,
                            local_190.first.field_2._M_allocated_capacity + 1);
          }
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,4);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,0x18);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,0x18);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,0);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,0);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,0);
          PacketBuilder::AddShort((PacketBuilder *)local_1c0,2);
          PacketBuilder::AddChar((PacketBuilder *)local_1c0,0);
          PacketBuilder::AddByte((PacketBuilder *)local_1c0,0xff);
          Player::Send(local_128,(PacketBuilder *)local_1c0);
          PacketBuilder::~PacketBuilder((PacketBuilder *)local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          (*(character->super_Command_Source)._vptr_Command_Source[2])(local_1c0,character);
          PacketBuilder::PacketBuilder
                    ((PacketBuilder *)&local_190,PACKET_WELCOME,PACKET_REPLY,
                     (size_t)(local_1c0._8_8_ +
                             (character->spells).
                             super__List_base<Character_Spell,_std::allocator<Character_Spell>_>.
                             _M_impl._M_node._M_size * 4 +
                             (character->inventory).
                             super__List_base<Character_Item,_std::allocator<Character_Item>_>.
                             _M_impl._M_node._M_size * 6 + 0x41));
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
          }
          PacketBuilder::AddShort((PacketBuilder *)&local_190,2);
          PacketBuilder::AddByte((PacketBuilder *)&local_190,0xff);
          iVar7 = 9;
          do {
            PacketBuilder::AddByte((PacketBuilder *)&local_190,0xff);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,character->weight);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,character->maxweight);
          p_Var14 = (_List_node_base *)&character->inventory;
          while (p_Var14 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                            &p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var14 != (_List_node_base *)&character->inventory) {
            iVar7 = *(int *)((long)&p_Var14[1]._M_next + 4);
            PacketBuilder::AddShort((PacketBuilder *)&local_190,(int)*(short *)&p_Var14[1]._M_next);
            PacketBuilder::AddInt((PacketBuilder *)&local_190,iVar7);
          }
          PacketBuilder::AddByte((PacketBuilder *)&local_190,0xff);
          p_Var14 = (_List_node_base *)&character->spells;
          while (p_Var14 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)
                            &p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var14 != (_List_node_base *)&character->spells) {
            bVar1 = *(undefined1 *)((long)&p_Var14[1]._M_next + 2);
            PacketBuilder::AddShort((PacketBuilder *)&local_190,(int)*(short *)&p_Var14[1]._M_next);
            PacketBuilder::AddShort((PacketBuilder *)&local_190,(uint)bVar1);
          }
          PacketBuilder::AddByte((PacketBuilder *)&local_190,0xff);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,1);
          PacketBuilder::AddByte((PacketBuilder *)&local_190,0xff);
          (*(character->super_Command_Source)._vptr_Command_Source[2])(local_1c0,character);
          PacketBuilder::AddBreakString((PacketBuilder *)&local_190,(string *)local_1c0,0xff);
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
          }
          iVar7 = Character::PlayerID(character);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,iVar7);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,(int)character->mapid);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,(uint)character->x);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,(uint)character->y);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,(uint)character->direction);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,6);
          Character::PaddedGuildTag_abi_cxx11_((string *)local_1c0,character);
          PacketBuilder::AddString((PacketBuilder *)&local_190,(string *)local_1c0);
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
          }
          PacketBuilder::AddChar((PacketBuilder *)&local_190,(uint)character->level);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,(uint)character->gender);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,(uint)character->hairstyle);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,(uint)character->haircolor);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,(uint)character->race);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,character->maxhp);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,character->hp);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,character->maxtp);
          PacketBuilder::AddShort((PacketBuilder *)&local_190,character->tp);
          Character::AddPaperdollData(character,(PacketBuilder *)&local_190,"B000A0HSW");
          PacketBuilder::AddChar((PacketBuilder *)&local_190,(uint)character->sitting);
          PacketBuilder::AddChar((PacketBuilder *)&local_190,character->hidden & 1);
          PacketBuilder::AddByte((PacketBuilder *)&local_190,0xff);
          PacketBuilder::AddByte((PacketBuilder *)&local_190,0xff);
          Player::Send(local_128,(PacketBuilder *)&local_190);
          PacketBuilder::~PacketBuilder((PacketBuilder *)&local_190);
          Character::Warp(character,character->mapid,character->x,character->y,WARP_ANIMATION_NONE);
          return;
        }
        ppCVar13 = ppCVar13 + 1;
      } while (ppCVar13 != ppCVar3);
    }
    iVar7 = (*(from->super_Command_Source)._vptr_Command_Source[4])(from);
    local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"character_not_found","");
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var,iVar7) + 0x490),&local_190.first);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0011f5e5;
  }
  else {
    iVar7 = (*(from->super_Command_Source)._vptr_Command_Source[4])(from);
    local_190.first._M_dataplus._M_p = (pointer)&local_190.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"unknown_command","");
    I18N::Format<>(&local_50,(I18N *)(CONCAT44(extraout_var_00,iVar7) + 0x490),&local_190.first);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0011f5e5;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0011f5e5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.first._M_dataplus._M_p != &local_190.first.field_2) {
    operator_delete(local_190.first._M_dataplus._M_p,
                    local_190.first.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Duty(const std::vector<std::string>& arguments, Character* from)
{
	World* world = from->world;

	if (!world->config["UseDutyAdmin"])
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return;
	}

	Player* player = from->player;
	Character* swap = nullptr;

	bool dutyoff = !player->dutylast.empty();

	for (Character* c : from->player->characters)
	{
		if ((dutyoff && c->real_name == player->dutylast)
		 || (!dutyoff && c != from && c->admin))
		{
			if (player->dutylast.empty())
				player->dutylast = from->real_name;
			else
				player->dutylast.clear();

			swap = c;
			break;
		}
	}

	if (!swap)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
		return;
	}

	from->Logout();
	player->character = swap;

	if (!dutyoff && arguments.size() > 0 && util::lowercase(arguments[0]) == "here")
	{
		swap->mapid = from->mapid;
		swap->x = from->x;
		swap->y = from->y;
		swap->direction = from->direction;
		swap->sitting = from->sitting;
	}

	swap->faux_name = from->SourceName();

	world->Login(swap);
	swap->CalculateStats();

	{
		std::string guild_str = swap->GuildNameString();
		std::string guild_rank = swap->GuildRankString();

		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY,
			114 + swap->paperdoll.size() * 2 + swap->SourceName().length() + swap->title.length()
			+ guild_str.length() + guild_rank.length());

		reply.AddShort(1); // REPLY_WELCOME sub-id
		reply.AddShort(swap->PlayerID());
		reply.AddInt(swap->id);
		reply.AddShort(swap->mapid); // Map ID

		if (world->config["GlobalPK"] && !world->PKExcept(swap->mapid))
		{
			reply.AddByte(0xFF);
			reply.AddByte(0x01);
		}
		else
		{
			reply.AddByte(world->GetMap(swap->mapid)->rid[0]);
			reply.AddByte(world->GetMap(swap->mapid)->rid[1]);
		}

		reply.AddByte(world->GetMap(swap->mapid)->rid[2]);
		reply.AddByte(world->GetMap(swap->mapid)->rid[3]);
		reply.AddThree(world->GetMap(swap->mapid)->filesize);
		reply.AddByte(world->eif->rid[0]);
		reply.AddByte(world->eif->rid[1]);
		reply.AddByte(world->eif->rid[2]);
		reply.AddByte(world->eif->rid[3]);
		reply.AddByte(world->eif->len[0]);
		reply.AddByte(world->eif->len[1]);
		reply.AddByte(world->enf->rid[0]);
		reply.AddByte(world->enf->rid[1]);
		reply.AddByte(world->enf->rid[2]);
		reply.AddByte(world->enf->rid[3]);
		reply.AddByte(world->enf->len[0]);
		reply.AddByte(world->enf->len[1]);
		reply.AddByte(world->esf->rid[0]);
		reply.AddByte(world->esf->rid[1]);
		reply.AddByte(world->esf->rid[2]);
		reply.AddByte(world->esf->rid[3]);
		reply.AddByte(world->esf->len[0]);
		reply.AddByte(world->esf->len[1]);
		reply.AddByte(world->ecf->rid[0]);
		reply.AddByte(world->ecf->rid[1]);
		reply.AddByte(world->ecf->rid[2]);
		reply.AddByte(world->ecf->rid[3]);
		reply.AddByte(world->ecf->len[0]);
		reply.AddByte(world->ecf->len[1]);
		reply.AddBreakString(swap->SourceName());
		reply.AddBreakString(swap->title);
		reply.AddBreakString(guild_str); // Guild Name
		reply.AddBreakString(guild_rank); // Guild Rank
		reply.AddChar(swap->clas);
		reply.AddString(swap->PaddedGuildTag());

		// Tell a player's client they're a higher level admin than they are to enable some features

		AdminLevel lowest_command = ADMIN_HGM;

		UTIL_FOREACH(world->admin_config, ac)
		{
			if (ac.first == "killnpc" || ac.first == "reports")
			{
				continue;
			}

			lowest_command = std::min<AdminLevel>(lowest_command, static_cast<AdminLevel>(util::to_int(ac.second)));
		}

		if (swap->SourceAccess() >= static_cast<int>(world->admin_config["seehide"])
		 && swap->SourceAccess() < ADMIN_HGM)
		{
			reply.AddChar(ADMIN_HGM);
		}
		else if (swap->SourceDutyAccess() >= static_cast<int>(world->admin_config["nowall"])
		 && swap->SourceDutyAccess() < ADMIN_GM)
		{
			reply.AddChar(ADMIN_GM);
		}
		else if (swap->SourceAccess() >= lowest_command
		 && swap->SourceAccess() < ADMIN_GUIDE)
		{
			reply.AddChar(ADMIN_GUIDE);
		}
		else
		{
			reply.AddChar(swap->SourceAccess());
		}

		reply.AddChar(swap->level);
		reply.AddInt(swap->exp);
		reply.AddInt(swap->usage);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->tp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->maxsp);
		reply.AddShort(swap->statpoints);
		reply.AddShort(swap->skillpoints);
		reply.AddShort(swap->karma);
		reply.AddShort(swap->mindam);
		reply.AddShort(swap->maxdam);
		reply.AddShort(swap->accuracy);
		reply.AddShort(swap->evade);
		reply.AddShort(swap->armor);

		if (!world->config["OldVersionCompat"] && player->client->version < 28)
		{
			reply.AddChar(swap->display_str);
			reply.AddChar(swap->display_wis);
			reply.AddChar(swap->display_intl);
			reply.AddChar(swap->display_agi);
			reply.AddChar(swap->display_con);
			reply.AddChar(swap->display_cha);
		}
		else
		{
			reply.AddShort(swap->display_str);
			reply.AddShort(swap->display_wis);
			reply.AddShort(swap->display_intl);
			reply.AddShort(swap->display_agi);
			reply.AddShort(swap->display_con);
			reply.AddShort(swap->display_cha);
		}

		UTIL_FOREACH(swap->paperdoll, item)
		{
			reply.AddShort(item);
		}

		int leader_rank = std::max(std::max(std::max(static_cast<int>(world->config["GuildEditRank"]), static_cast<int>(world->config["GuildKickRank"])),
								   static_cast<int>(world->config["GuildPromoteRank"])), static_cast<int>(world->config["GuildDemoteRank"]));

		if (swap->guild_rank <= leader_rank && swap->guild)
		{
			reply.AddChar(1); // Allows client access to the guild management tools
		}
		else
		{
			reply.AddChar(swap->guild_rank);
		}

		reply.AddShort(static_cast<int>(world->config["JailMap"]));
		reply.AddShort(4); // ?
		reply.AddChar(24); // ?
		reply.AddChar(24); // ?
		reply.AddShort(0); // Light guide admin command flood rate
		reply.AddShort(0); // Guardian admin command flood rate
		reply.AddShort(0); // GM/HGM admin command flood rate
		reply.AddShort(2); // ?
		reply.AddChar(0); // Login warning message
		reply.AddByte(255);

		player->Send(reply);
	}

	{
		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY, 65 + swap->SourceName().length() + swap->inventory.size() * 6 + swap->spells.size() * 4);

		reply.AddShort(2); // REPLY_WELCOME sub-id
		// MotDs
		reply.AddByte(255);

		for (int i = 0; i < 9; ++i)
		{
			reply.AddByte(255);
		}

		// ??
		reply.AddChar(swap->weight); // Weight
		reply.AddChar(swap->maxweight); // Max Weight
		UTIL_FOREACH(swap->inventory, item)
		{
			reply.AddShort(item.id);
			reply.AddInt(item.amount);
		}
		reply.AddByte(255);
		UTIL_FOREACH(swap->spells, spell)
		{
			reply.AddShort(spell.id); // Spell ID
			reply.AddShort(spell.level); // Spell Level
		}
		reply.AddByte(255);

		reply.AddChar(1); // Number of players
		reply.AddByte(255);

		reply.AddBreakString(swap->SourceName());
		reply.AddShort(swap->PlayerID());
		reply.AddShort(swap->mapid);
		reply.AddShort(swap->x);
		reply.AddShort(swap->y);
		reply.AddChar(swap->direction);
		reply.AddChar(6); // ?
		reply.AddString(swap->PaddedGuildTag());
		reply.AddChar(swap->level);
		reply.AddChar(swap->gender);
		reply.AddChar(swap->hairstyle);
		reply.AddChar(swap->haircolor);
		reply.AddChar(swap->race);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->tp);
		swap->AddPaperdollData(reply, "B000A0HSW");
		reply.AddChar(swap->sitting);
		reply.AddChar(swap->IsHideInvisible());
		reply.AddByte(255);

		reply.AddByte(255);

		player->Send(reply);
	}

	swap->Warp(swap->mapid, swap->x, swap->y, WARP_ANIMATION_NONE);
}